

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.cpp
# Opt level: O0

void miss(char *er,char *ee,bool noend)

{
  char *pcVar1;
  int local_20;
  int i;
  bool noend_local;
  char *ee_local;
  char *er_local;
  
  if (!to_death) {
    pcVar1 = prname(er,true);
    addmsg(pcVar1);
    if ((terse & 1U) == 0) {
      local_20 = rnd(4);
    }
    else {
      local_20 = 0;
    }
    if (er != (char *)0x0) {
      local_20 = local_20 + 4;
    }
    addmsg(m_names[local_20]);
    if ((terse & 1U) == 0) {
      pcVar1 = prname(ee,false);
      addmsg(" %s",pcVar1);
    }
    if (!noend) {
      endmsg();
    }
  }
  return;
}

Assistant:

void miss(const char *er, const char *ee, bool noend)
{
    int i;

    if (to_death)
        return;
    addmsg(prname(er, true));
    if (terse)
        i = 0;
    else
        i = rnd(4);
    if (er != nullptr)
        i += 4;
    addmsg(m_names[i]);
    if (!terse)
        addmsg(" %s", prname(ee, false));
    if (!noend)
        endmsg();
}